

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  Type TVar1;
  TestPartResultArray *this_00;
  pointer pcVar2;
  int iVar3;
  stringstream *psVar4;
  TestPartResult *pTVar5;
  AssertionResult *pAVar6;
  AssertHelperData *pAVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer *__ptr;
  int index;
  char *pcVar9;
  Message msg;
  AssertionResult gtest_ar;
  string expected;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  undefined1 local_70 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  undefined1 local_60 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = this->results_;
  TVar1 = this->type_;
  pcVar9 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar9 = "1 fatal failure";
  }
  local_50._0_8_ = (stringstream *)(local_50 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,pcVar9,pcVar9 + (ulong)(TVar1 != kFatalFailure) * 4 + 0xf);
  psVar4 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(psVar4);
  *(undefined8 *)(psVar4 + 0x18 + *(long *)(*(long *)(psVar4 + 0x10) + -0x18)) = 0x11;
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4;
  if ((int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249 == 1) {
    pTVar5 = TestPartResultArray::GetTestPartResult(this_00,0);
    if (pTVar5->type_ == TVar1) {
      pcVar9 = strstr((pTVar5->message_)._M_dataplus._M_p,(this->substr_)._M_dataplus._M_p);
      if (pcVar9 != (char *)0x0) {
        local_70[0] = true;
        local_68._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        goto LAB_001603e6;
      }
      local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffffffffff00);
      local_58._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar6 = AssertionResult::operator<<((AssertionResult *)local_60,(char (*) [11])0x1f3b13);
      pAVar6 = AssertionResult::operator<<
                         (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [14])" containing \"");
      pAVar6 = AssertionResult::operator<<(pAVar6,&this->substr_);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [3])0x1f448f);
    }
    else {
      local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffffffffff00);
      local_58._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar6 = AssertionResult::operator<<((AssertionResult *)local_60,(char (*) [11])0x1f3b13);
      pAVar6 = AssertionResult::operator<<
                         (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [2])0x1f4140);
    }
    pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [11])"  Actual:\n");
    pAVar6 = AssertionResult::operator<<(pAVar6,pTVar5);
    AssertionResult::AssertionResult((AssertionResult *)local_70,pAVar6);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar4 + 0x10),"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),(char *)local_50._0_8_,local_50._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),"  Actual: ",10);
    std::ostream::operator<<
              ((ostream *)(local_78._M_head_impl + 0x10),
               (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10)," failures",9);
    if (0 < (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249) {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_78._M_head_impl + 0x10),"\n",1);
        pTVar5 = TestPartResultArray::GetTestPartResult(this_00,index);
        testing::operator<<((ostream *)(local_78._M_head_impl + 0x10),pTVar5);
        index = index + 1;
        iVar3 = (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4);
      } while (SBORROW4(index,iVar3 * -0x49249249) != index + iVar3 * 0x49249249 < 0);
    }
    local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffffffffff00);
    local_58._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
    pAVar6 = AssertionResult::operator<<((AssertionResult *)local_60,(Message *)&local_78);
    AssertionResult::AssertionResult((AssertionResult *)local_70,pAVar6);
  }
  if (local_58._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58._M_head_impl);
  }
LAB_001603e6:
  if (local_78._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_78._M_head_impl + 8))();
  }
  if ((stringstream *)local_50._0_8_ != (stringstream *)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
  }
  if (local_70[0] == false) {
    psVar4 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar4);
    *(undefined8 *)(psVar4 + *(long *)(*(long *)(psVar4 + 0x10) + -0x18) + 0x18) = 0x11;
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68._M_head_impl ==
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_68._M_head_impl)->_M_dataplus)._M_p;
    }
    local_50._0_8_ = psVar4;
    pAVar7 = (AssertHelperData *)operator_new(0x38);
    pAVar7->type = kNonFatalFailure;
    pAVar7->file = 
    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/gtest/googletest/src/gtest.cc"
    ;
    pAVar7->line = 0x2bd;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pAVar7->message,pcVar9,(allocator<char> *)local_60);
    local_60 = (undefined1  [8])pAVar7;
    AssertHelper::operator=((AssertHelper *)local_60,(Message *)local_50);
    AssertHelper::~AssertHelper((AssertHelper *)local_60);
    (**(code **)(*(long *)psVar4 + 8))(psVar4);
  }
  if (local_68._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68._M_head_impl);
  }
  pcVar2 = (this->substr_)._M_dataplus._M_p;
  paVar8 = &(this->substr_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar8) {
    operator_delete(pcVar2,paVar8->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}